

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O1

void __thiscall
dg::dda::MemorySSATransformation::findDefinitionsInSubgraph
          (MemorySSATransformation *this,RWNode *phi,RWNodeCall *C,DefSite *ds,RWSubgraph *subg)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  RWBBlock *block;
  undefined8 uVar4;
  ulong uVar5;
  DefinitionsMap<dg::dda::RWNode> *this_00;
  DefUses *this_01;
  bool bVar6;
  mapped_type *pmVar7;
  mapped_type *si;
  ulong uVar8;
  RWNode *pRVar9;
  _List_node_base *p_Var10;
  _Base_ptr p_Var11;
  undefined1 auVar12 [8];
  DefinitionsMap<dg::dda::RWNode> *this_02;
  pointer pDVar13;
  undefined8 *puVar14;
  DefSite subgds;
  undefined1 local_e8 [8];
  _Rb_tree_node_base local_e0;
  RWNodeCall *local_b8;
  RWSubgraph *local_b0;
  ulong local_a8;
  ulong local_a0;
  DefinitionsMap<dg::dda::RWNode> *local_98;
  pointer local_90;
  DefUses *local_88;
  pointer local_80;
  DefSite local_78;
  DefSite local_60;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  local_48;
  
  local_e8 = (undefined1  [8])subg;
  local_b8 = C;
  pmVar7 = std::__detail::
           _Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->_subgraphs_info,(key_type *)local_e8);
  local_e8 = (undefined1  [8])subg;
  si = std::__detail::
       _Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
       ::operator[]((_Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->_subgraphs_info,(key_type *)local_e8);
  local_b0 = subg;
  computeModRef(this,subg,si);
  this_02 = &(pmVar7->summary).outputs;
  DefinitionsMap<dg::dda::RWNode>::get
            ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)local_e8,this_02,ds);
  local_88 = &phi->defuse;
  RWNode::DefUses::
  add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
            (local_88,(set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                       *)local_e8);
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::_M_erase((_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)local_e8,(_Link_type)local_e0._M_parent);
  DefinitionsMap<dg::dda::RWNode>::undefinedIntervals(&local_48,this_02,ds);
  local_90 = local_48.
             super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a8 = Offset::UNKNOWN - 1;
    local_98 = &(si->modref).maydef;
    local_a0 = Offset::UNKNOWN;
    pDVar13 = local_48.
              super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = local_98;
      uVar5 = local_a0;
      uVar1 = (pDVar13->end).offset;
      uVar8 = local_a0;
      if (uVar1 != local_a0) {
        uVar2 = (pDVar13->start).offset;
        uVar8 = uVar1 - uVar2;
        if (uVar1 < uVar2) {
          uVar8 = local_a0;
        }
        if (uVar2 == local_a0) {
          uVar8 = local_a0;
        }
      }
      local_78.len.offset = uVar8 + 1;
      if (local_a8 <= uVar8) {
        local_78.len.offset = local_a0;
      }
      local_78.target = ds->target;
      if (uVar8 == local_a0) {
        local_78.len.offset = local_a0;
      }
      local_78.offset.offset = (pDVar13->start).offset;
      bVar6 = DefinitionsMap<dg::dda::RWNode>::definesTarget(local_98,local_78.target);
      this_01 = local_88;
      local_80 = pDVar13;
      if (bVar6) {
        pRVar9 = createPhi(this,&local_78,OUTARG);
        DefinitionsMap<dg::dda::RWNode>::add(this_02,&local_78,pRVar9);
        RWNode::DefUses::add(this_01,pRVar9);
        puVar14 = *(undefined8 **)local_b0;
        puVar3 = *(undefined8 **)(local_b0 + 8);
        if (puVar14 != puVar3) {
          do {
            block = (RWBBlock *)*puVar14;
            if ((block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                _successors.
                super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                *(pointer *)
                 ((long)&(block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                         super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                         _successors.
                         super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>
                         ._M_impl.super__Vector_impl_data + 8)) {
              if ((block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
                  super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                  _M_node.super__List_node_base._M_next ==
                  (_List_node_base *)
                  &(block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes) {
                p_Var10 = (_List_node_base *)0x0;
              }
              else {
                p_Var10 = (block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
                          super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                          _M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
              }
              if ((p_Var10 != (_List_node_base *)0x0) && (*(int *)&p_Var10[9]._M_next == 0xc)) {
                findDefinitions((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                                local_e8,this,block,ds);
                uVar4 = local_e0._0_8_;
                (pRVar9->defuse)._init = true;
                for (auVar12 = local_e8; auVar12 != (undefined1  [8])uVar4;
                    auVar12 = (undefined1  [8])((long)auVar12 + 8)) {
                  RWNode::DefUses::add(&pRVar9->defuse,*(RWNode **)auVar12);
                }
                if (local_e8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_e8,(long)local_e0._M_parent - (long)local_e8);
                }
              }
            }
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar3);
        }
      }
      else {
        bVar6 = DefinitionsMap<dg::dda::RWNode>::definesTarget(this_00,(RWNode *)UNKNOWN_MEMORY);
        if (bVar6) {
          pRVar9 = createPhi(this,&local_78,OUTARG);
          DefinitionsMap<dg::dda::RWNode>::add(this_02,&local_78,pRVar9);
          local_60.target = (RWNode *)UNKNOWN_MEMORY;
          local_60.offset.offset = uVar5;
          local_60.len.offset = uVar5;
          DefinitionsMap<dg::dda::RWNode>::get
                    ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                      *)local_e8,this_00,&local_60);
          if (local_e0._M_left != &local_e0) {
            p_Var11 = local_e0._M_left;
            do {
              RWNode::DefUses::add(&pRVar9->defuse,*(RWNode **)(p_Var11 + 1));
              p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
            } while (p_Var11 != &local_e0);
          }
          std::
          _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
          ::_M_erase((_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                      *)local_e8,(_Link_type)local_e0._M_parent);
          RWNode::DefUses::add(this_01,pRVar9);
        }
        findDefinitions((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)local_e8,
                        this,&local_b8->super_RWNode,&local_78);
        uVar4 = local_e0._0_8_;
        (phi->defuse)._init = true;
        for (auVar12 = local_e8; auVar12 != (undefined1  [8])uVar4;
            auVar12 = (undefined1  [8])((long)auVar12 + 8)) {
          RWNode::DefUses::add(this_01,*(RWNode **)auVar12);
        }
        if (local_e8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_e8,(long)local_e0._M_parent - (long)local_e8);
        }
      }
      pDVar13 = local_80 + 1;
    } while (pDVar13 != local_90);
  }
  if (local_48.
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MemorySSATransformation::findDefinitionsInSubgraph(RWNode *phi,
                                                        RWNodeCall *C,
                                                        const DefSite &ds,
                                                        RWSubgraph *subg) {
    DBG_SECTION_BEGIN(tmp,
                      "Searching definitions in subgraph " << subg->getName());
    auto &summary = getSubgraphSummary(subg);
    auto &si = getSubgraphInfo(subg);
    computeModRef(subg, si);
    assert(si.modref.isInitialized());

    // Add the definitions that we have found in previous exploration
    phi->addDefUse(summary.getOutputs(ds));

    // search the definitions that we have not found yet
    for (auto &subginterval : summary.getUncoveredOutputs(ds)) {
        // we must create a new phi for each subgraph inside the subgraph
        // (these phis will be merged by the single 'phi').
        // Of course, we create them only when not already present.
        auto subgds =
                DefSite{ds.target, subginterval.start, subginterval.length()};

        // do not search the procedure if it cannot define the memory
        // (this saves creating PHI nodes). If it may define only
        // unknown memory, add that definitions directly and continue searching
        // before the call.
        if (!si.modref.mayDefine(ds.target)) {
            if (si.modref.mayDefineUnknown()) {
                auto *subgphi =
                        createPhi(subgds, /* type = */ RWNodeType::OUTARG);
                summary.addOutput(subgds, subgphi);
                for (const auto &it : si.modref.getMayDef(UNKNOWN_MEMORY)) {
                    subgphi->addDefUse(it);
                }
                phi->addDefUse(subgphi);
            }
            // continue the search before the call
            phi->addDefUse(findDefinitions(C, subgds));
            continue;
        }

        auto *subgphi = createPhi(subgds, /* type = */ RWNodeType::OUTARG);
        summary.addOutput(subgds, subgphi);
        phi->addDefUse(subgphi);

        // find the new phi operands
        for (auto *subgblock : subg->bblocks()) {
            if (subgblock->hasSuccessors()) {
                continue;
            }
            if (!subgblock->isReturnBBlock()) {
                // ignore blocks that does not return to this subgraph
                continue;
            }
            subgphi->addDefUse(findDefinitions(subgblock, ds));
        }
    }
    DBG_SECTION_END(tmp, "Done searching definitions in subgraph "
                                 << subg->getName());
}